

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3VdbeMemStoreType(Mem *pMem)

{
  ushort uVar1;
  
  uVar1 = pMem->flags;
  if ((uVar1 & 1) != 0) {
    pMem->type = '\x05';
    return;
  }
  if ((uVar1 & 4) != 0) {
    pMem->type = '\x01';
    return;
  }
  if ((uVar1 & 8) != 0) {
    pMem->type = '\x02';
    return;
  }
  if ((uVar1 & 2) == 0) {
    pMem->type = '\x04';
    return;
  }
  pMem->type = '\x03';
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3VdbeMemStoreType(Mem *pMem){
  int flags = pMem->flags;
  if( flags & MEM_Null ){
    pMem->type = SQLITE_NULL;
  }
  else if( flags & MEM_Int ){
    pMem->type = SQLITE_INTEGER;
  }
  else if( flags & MEM_Real ){
    pMem->type = SQLITE_FLOAT;
  }
  else if( flags & MEM_Str ){
    pMem->type = SQLITE_TEXT;
  }else{
    pMem->type = SQLITE_BLOB;
  }
}